

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::EventModuleField::~EventModuleField(EventModuleField *this)

{
  pointer pTVar1;
  pointer pcVar2;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__EventModuleField_001a8ff0;
  pTVar1 = (this->event).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pTVar1 = (this->event).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  Var::~Var(&(this->event).decl.type_var);
  pcVar2 = (this->event).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->event).name.field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit EventModuleField(const Location& loc = Location(),
                            string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Event>(loc), event(name) {}